

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

VdbeCursor * allocateCursor(Vdbe *p,int iCur,int nField,u8 eCurType)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  VdbeCursor *pVVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  Mem *pMVar8;
  
  pMVar8 = p->aMem;
  lVar7 = (long)iCur;
  if (0 < iCur) {
    pMVar8 = pMVar8 + (p->nMem - lVar7);
  }
  lVar1 = (long)nField * 8;
  lVar2 = lVar1 + 0x78;
  iVar6 = nField * 8 + 0x1a0;
  if (eCurType != '\0') {
    iVar6 = (int)lVar2;
  }
  if (p->apCsr[lVar7] != (VdbeCursor *)0x0) {
    sqlite3VdbeFreeCursorNN(p,p->apCsr[lVar7]);
    p->apCsr[lVar7] = (VdbeCursor *)0x0;
  }
  if (pMVar8->szMalloc < iVar6) {
    if (0 < pMVar8->szMalloc) {
      sqlite3DbFreeNN(pMVar8->db,pMVar8->zMalloc);
    }
    if (pMVar8->db == (sqlite3 *)0x0) {
      pcVar5 = (char *)sqlite3Malloc((long)iVar6);
    }
    else {
      pcVar5 = (char *)sqlite3DbMallocRawNN(pMVar8->db,(long)iVar6);
    }
    pMVar8->zMalloc = pcVar5;
    pMVar8->z = pcVar5;
    if (pcVar5 == (char *)0x0) {
      pMVar8->szMalloc = 0;
      return (VdbeCursor *)0x0;
    }
    pMVar8->szMalloc = iVar6;
  }
  pVVar4 = (VdbeCursor *)pMVar8->zMalloc;
  p->apCsr[lVar7] = pVVar4;
  pVVar4->eCurType = '\0';
  pVVar4->iDb = '\0';
  pVVar4->nullRow = '\0';
  pVVar4->deferredMoveto = '\0';
  pVVar4->isTable = '\0';
  pVVar4->field_0x5 = 0;
  pVVar4->seekHit = 0;
  (pVVar4->ub).pBtx = (Btree *)0x0;
  pVVar4->seqCount = 0;
  pVVar4->cacheStatus = 0;
  pVVar4->seekResult = 0;
  pVVar4->eCurType = eCurType;
  pVVar4->nField = (i16)nField;
  pVVar4->aOffset = pVVar4->aType + nField;
  if (eCurType == '\0') {
    pcVar5 = pMVar8->z;
    (pVVar4->uc).pCursor = (BtCursor *)(pcVar5 + lVar2);
    pcVar3 = pcVar5 + lVar1 + 0x88;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\0';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    pcVar5 = pcVar5 + lVar2;
    pcVar5[0] = '\0';
    pcVar5[1] = '\0';
    pcVar5[2] = '\0';
    pcVar5[3] = '\0';
    pcVar5[4] = '\0';
    pcVar5[5] = '\0';
    pcVar5[6] = '\0';
    pcVar5[7] = '\0';
    pcVar5[8] = '\0';
    pcVar5[9] = '\0';
    pcVar5[10] = '\0';
    pcVar5[0xb] = '\0';
    pcVar5[0xc] = '\0';
    pcVar5[0xd] = '\0';
    pcVar5[0xe] = '\0';
    pcVar5[0xf] = '\0';
  }
  return pVVar4;
}

Assistant:

static VdbeCursor *allocateCursor(
  Vdbe *p,              /* The virtual machine */
  int iCur,             /* Index of the new VdbeCursor */
  int nField,           /* Number of fields in the table or index */
  u8 eCurType           /* Type of the new cursor */
){
  /* Find the memory cell that will be used to store the blob of memory
  ** required for this VdbeCursor structure. It is convenient to use a
  ** vdbe memory cell to manage the memory allocation required for a
  ** VdbeCursor structure for the following reasons:
  **
  **   * Sometimes cursor numbers are used for a couple of different
  **     purposes in a vdbe program. The different uses might require
  **     different sized allocations. Memory cells provide growable
  **     allocations.
  **
  **   * When using ENABLE_MEMORY_MANAGEMENT, memory cell buffers can
  **     be freed lazily via the sqlite3_release_memory() API. This
  **     minimizes the number of malloc calls made by the system.
  **
  ** The memory cell for cursor 0 is aMem[0]. The rest are allocated from
  ** the top of the register space.  Cursor 1 is at Mem[p->nMem-1].
  ** Cursor 2 is at Mem[p->nMem-2]. And so forth.
  */
  Mem *pMem = iCur>0 ? &p->aMem[p->nMem-iCur] : p->aMem;

  int nByte;
  VdbeCursor *pCx = 0;
  nByte =
      ROUND8P(sizeof(VdbeCursor)) + 2*sizeof(u32)*nField +
      (eCurType==CURTYPE_BTREE?sqlite3BtreeCursorSize():0);

  assert( iCur>=0 && iCur<p->nCursor );
  if( p->apCsr[iCur] ){ /*OPTIMIZATION-IF-FALSE*/
    sqlite3VdbeFreeCursorNN(p, p->apCsr[iCur]);
    p->apCsr[iCur] = 0;
  }

  /* There used to be a call to sqlite3VdbeMemClearAndResize() to make sure
  ** the pMem used to hold space for the cursor has enough storage available
  ** in pMem->zMalloc.  But for the special case of the aMem[] entries used
  ** to hold cursors, it is faster to in-line the logic. */
  assert( pMem->flags==MEM_Undefined );
  assert( (pMem->flags & MEM_Dyn)==0 );
  assert( pMem->szMalloc==0 || pMem->z==pMem->zMalloc );
  if( pMem->szMalloc<nByte ){
    if( pMem->szMalloc>0 ){
      sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
    }
    pMem->z = pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, nByte);
    if( pMem->zMalloc==0 ){
      pMem->szMalloc = 0;
      return 0;
    }
    pMem->szMalloc = nByte;
  }

  p->apCsr[iCur] = pCx = (VdbeCursor*)pMem->zMalloc;
  memset(pCx, 0, offsetof(VdbeCursor,pAltCursor));
  pCx->eCurType = eCurType;
  pCx->nField = nField;
  pCx->aOffset = &pCx->aType[nField];
  if( eCurType==CURTYPE_BTREE ){
    pCx->uc.pCursor = (BtCursor*)
        &pMem->z[ROUND8P(sizeof(VdbeCursor))+2*sizeof(u32)*nField];
    sqlite3BtreeCursorZero(pCx->uc.pCursor);
  }
  return pCx;
}